

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_mb_modes_kf(AV1_COMP *cpi,MACROBLOCKD *xd,MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
                      aom_writer *w)

{
  int iVar1;
  MB_MODE_INFO *in_RCX;
  MACROBLOCKD *in_RDX;
  AV1_COMP *in_RSI;
  MACROBLOCKD *in_RDI;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  int skip;
  MB_MODE_INFO *mbmi;
  segmentation_probs *segp;
  segmentation *seg;
  FRAME_CONTEXT *ec_ctx;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffb0;
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *mi;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame_00;
  MACROBLOCKD *xd_00;
  AV1_COMMON *cm_00;
  int skip_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI[0x10].plane[1].seg_qmatrix[4] + 0xe);
  xd_00 = *(MACROBLOCKD **)((in_RSI->enc_quant_dequant_params).quants.y_zbin[0x98] + 4);
  mbmi_ext_frame_00 = (MB_MODE_INFO_EXT_FRAME *)(in_RDI[0x11].ref_mv_stack[5] + 6);
  mi = (MB_MODE_INFO *)((xd_00->cfl).recon_buf_q3 + 0x359);
  mbmi_00 = (MB_MODE_INFO *)
            **(undefined8 **)((in_RSI->enc_quant_dequant_params).quants.y_quant_shift[0xea] + 4);
  if ((*(char *)&in_RDI[0x11].ref_mv_stack[8][3].this_mv != '\0') &&
     (*(char *)((long)&in_RDI[0x11].ref_mv_stack[5][6].this_mv + 1) != '\0')) {
    write_segment_id(in_RSI,in_RDX,in_RCX,(aom_writer *)cm_00,(segmentation *)xd_00,
                     (segmentation_probs *)mbmi_ext_frame_00,unaff_retaddr);
  }
  iVar1 = write_skip(cm_00,xd_00,(uint8_t)((ulong)mbmi_ext_frame_00 >> 0x38),mi,
                     (aom_writer *)mbmi_00);
  if ((*(char *)&mbmi_ext_frame_00[2].ref_mv_stack[0].this_mv == '\0') &&
     (*(char *)((long)&mbmi_ext_frame_00->ref_mv_stack[0].this_mv + 1) != '\0')) {
    write_segment_id(in_RSI,in_RDX,in_RCX,(aom_writer *)cm_00,(segmentation *)xd_00,
                     (segmentation_probs *)mbmi_ext_frame_00,unaff_retaddr);
  }
  skip_00 = (int)((ulong)in_RCX >> 0x20);
  write_cdef((AV1_COMMON *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,(aom_writer *)in_RSI,
             (int)((ulong)in_RDX >> 0x20));
  write_delta_q_params((AV1_COMMON *)in_RSI,in_RDX,skip_00,(aom_writer *)cm_00);
  iVar1 = av1_allow_intrabc((AV1_COMMON *)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
  if (iVar1 != 0) {
    write_intrabc_info(xd_00,mbmi_ext_frame_00,(aom_writer *)mi);
    iVar1 = is_intrabc_block(mbmi_00);
    if (iVar1 != 0) {
      return;
    }
  }
  write_intra_prediction_modes((AV1_COMMON *)in_RSI,in_RDX,skip_00,(aom_writer *)cm_00);
  return;
}

Assistant:

static inline void write_mb_modes_kf(
    AV1_COMP *cpi, MACROBLOCKD *xd,
    const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame, aom_writer *w) {
  AV1_COMMON *const cm = &cpi->common;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  const MB_MODE_INFO *const mbmi = xd->mi[0];

  if (seg->segid_preskip && seg->update_map)
    write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);

  const int skip = write_skip(cm, xd, mbmi->segment_id, mbmi, w);

  if (!seg->segid_preskip && seg->update_map)
    write_segment_id(cpi, xd, mbmi, w, seg, segp, skip);

  write_cdef(cm, xd, w, skip);

  write_delta_q_params(cm, xd, skip, w);

  if (av1_allow_intrabc(cm)) {
    write_intrabc_info(xd, mbmi_ext_frame, w);
    if (is_intrabc_block(mbmi)) return;
  }

  write_intra_prediction_modes(cm, xd, 1, w);
}